

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O2

int __thiscall
baryonyx::itm::
solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
::select_variables(solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                   *this,rc_size *sizes,int bkmin,int bkmax)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar3 = sizes->c_size;
  iVar4 = iVar3 + bkmin;
  if (bkmin == bkmax) {
    if (sizes->r_size < iVar4) {
      iVar4 = sizes->r_size;
    }
    iVar3 = iVar4 + -1;
  }
  else {
    lVar6 = (long)iVar4;
    iVar4 = iVar3 + -1 + bkmin;
    iVar1 = bkmax + iVar3;
    if (sizes->r_size < bkmax + iVar3) {
      iVar1 = sizes->r_size;
    }
    lVar5 = lVar6 * 0xc;
    for (; lVar6 <= iVar1; lVar6 = lVar6 + 1) {
      bVar2 = stop_iterating<baryonyx::itm::maximize_tag,float>
                        (*(float *)((long)&((this->R)._M_t.
                                            super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
                                            .
                                            super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data_*,_false>
                                           ._M_head_impl)->value + lVar5),this->rng);
      if (bVar2) break;
      iVar4 = iVar4 + 1;
      lVar5 = lVar5 + 0xc;
    }
    iVar3 = iVar1 + -1;
    if (lVar6 <= iVar1) {
      iVar3 = iVar4;
    }
  }
  return iVar3;
}

Assistant:

int select_variables(const rc_size& sizes, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin + sizes.c_size, sizes.r_size) - 1;

        bkmin += sizes.c_size;
        bkmax = std::min(bkmax + sizes.c_size, sizes.r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }